

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t trap_order(wchar_t trap)

{
  _Bool _Var1;
  bitflag *flags;
  wchar_t wVar2;
  
  flags = trap_info[trap].flags;
  _Var1 = flag_has_dbg(flags,3,1,"t->flags","TRF_GLYPH");
  wVar2 = L'\0';
  if (!_Var1) {
    _Var1 = flag_has_dbg(flags,3,0xd,"t->flags","TRF_LOCK");
    wVar2 = L'\x01';
    if (!_Var1) {
      wVar2 = L'\x02';
      _Var1 = flag_has_dbg(flags,3,2,"t->flags","TRF_TRAP");
      if (!_Var1) {
        _Var1 = flag_has_dbg(flags,3,0x10,"t->flags","TRF_M_TRAP");
        wVar2 = L'\x04' - (uint)_Var1;
      }
    }
  }
  return wVar2;
}

Assistant:

static int trap_order(int trap)
{
	const struct trap_kind *t = &trap_info[trap];

	if (trf_has(t->flags, TRF_GLYPH))
		return 0;
	else if (trf_has(t->flags, TRF_LOCK))
		return 1;
	else if (trf_has(t->flags, TRF_TRAP))
		return 2;
	else if (trf_has(t->flags, TRF_M_TRAP))
		return 3;
	else
		return 4;
}